

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O2

void __thiscall
banksia::ChessBoard::gen_addMove
          (ChessBoard *this,vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *moveList,
          int from,int dest,bool captureOnly)

{
  Piece PVar1;
  MoveFull local_44;
  
  PVar1 = BoardCore::getPiece(&this->super_BoardCore,dest);
  local_44.piece = BoardCore::getPiece(&this->super_BoardCore,from);
  if (((ulong)PVar1 >> 0x20 != 2 || !captureOnly) && local_44.piece.side != PVar1.side) {
    local_44.super_Move.promotion = empty;
    local_44.super_Move.from = from;
    local_44.super_Move.dest = dest;
    std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::
    emplace_back<banksia::MoveFull>(moveList,&local_44);
  }
  return;
}

Assistant:

void ChessBoard::gen_addMove(std::vector<MoveFull>& moveList, int from, int dest, bool captureOnly) const
{
    auto toSide = getPiece(dest).side;
    auto movingPiece = getPiece(from);
    auto fromSide = movingPiece.side;
    
    if (fromSide != toSide && (!captureOnly || toSide != Side::none)) {
        moveList.push_back(MoveFull(movingPiece, from, dest));
    }
}